

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_matrix_matrix_addition_Test::TestBody
          (test_matrix_sparse_matrix_matrix_addition_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> non_zero_01;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Scalar *pSVar5;
  char *regex;
  AssertHelper local_938;
  Message local_930;
  int local_924;
  exception *gtest_exception;
  Matrix_Sparse local_8a8;
  ReturnSentinel local_858;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_830;
  DeathTest *gtest_dt;
  undefined8 uStack_820;
  undefined8 local_818;
  DeathTest **local_808;
  undefined8 uStack_800;
  unsigned_long local_7f8 [4];
  iterator local_7d8;
  undefined8 local_7d0;
  unsigned_long local_7c8 [4];
  iterator local_7a8;
  undefined8 local_7a0;
  undefined1 local_798 [8];
  Matrix_Sparse matrix_wrong_size;
  Message local_740;
  size_t local_738 [2];
  undefined1 local_728 [16];
  undefined1 local_718 [8];
  AssertionResult gtest_ar_19;
  Message local_700;
  pointer local_6f8;
  pointer local_6f0;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_18;
  Message local_6c0;
  pointer local_6b8;
  pointer local_6b0;
  undefined1 local_6a8 [16];
  undefined1 local_698 [8];
  AssertionResult gtest_ar_17;
  Message local_680;
  pointer local_678;
  pointer local_670;
  undefined1 local_668 [16];
  undefined1 local_658 [8];
  AssertionResult gtest_ar_16;
  Message local_640;
  pointer local_638;
  pointer local_630;
  undefined1 local_628 [16];
  undefined1 local_618 [8];
  AssertionResult gtest_ar_15;
  Message local_600;
  int local_5f4;
  pointer local_5f0;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_14;
  Message local_5d0;
  int local_5c4;
  size_t local_5c0;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_13;
  Message local_5a0;
  int local_594;
  size_t local_590;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_12;
  Message local_570;
  size_t local_568 [2];
  undefined1 local_558 [16];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_11;
  Message local_530;
  pointer local_528;
  pointer local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [8];
  AssertionResult gtest_ar_10;
  Message local_4f0;
  pointer local_4e8;
  pointer local_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_9;
  Message local_4b0;
  int local_4a4;
  pointer local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_8;
  Message local_480;
  int local_474;
  size_t local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_7;
  Message local_450;
  int local_444;
  size_t local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_6;
  Message local_420;
  size_t local_418 [2];
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_5;
  Message local_3e0;
  pointer local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_4;
  Message local_3a0;
  pointer local_398;
  pointer local_390;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  AssertionResult gtest_ar_3;
  Message local_360;
  int local_354;
  pointer local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_2;
  Message local_330;
  int local_324;
  size_t local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_1;
  Message local_300;
  int local_2f4;
  size_t local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar;
  Matrix_Sparse local_288;
  undefined1 local_238 [8];
  Matrix_Sparse matrix_result;
  double local_1d8 [4];
  iterator local_1b8;
  undefined8 uStack_1b0;
  unsigned_long local_1a8 [4];
  iterator local_188;
  undefined8 local_180;
  unsigned_long local_178 [4];
  iterator local_158;
  undefined8 local_150;
  undefined1 local_148 [8];
  Matrix_Sparse matrix;
  unsigned_long local_c8 [4];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse identity;
  test_matrix_sparse_matrix_matrix_addition_Test *this_local;
  
  local_98[2] = 2;
  local_98[3] = 3;
  local_98[0] = 0;
  local_98[1] = 1;
  local_70 = local_98;
  local_68 = 4;
  local_c8[0] = 0;
  local_c8[1] = 1;
  local_c8[2] = 2;
  local_a8 = local_c8;
  local_a0 = 3;
  matrix.column_size = 0x3ff0000000000000;
  non_zero_01._M_len = 4;
  non_zero_01._M_array = local_70;
  index_01._M_len = 3;
  index_01._M_array = local_a8;
  value._M_len = 3;
  value._M_array = (iterator)&matrix.column_size;
  identity.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero_01,index_01,value,3);
  local_178[2] = 2;
  local_178[3] = 3;
  local_178[0] = 0;
  local_178[1] = 1;
  local_158 = local_178;
  local_150 = 4;
  local_1a8[0] = 2;
  local_1a8[1] = 1;
  local_1a8[2] = 0;
  local_188 = local_1a8;
  local_180 = 3;
  local_1d8[2] = 5.0;
  local_1d8[0] = 3.0;
  local_1d8[1] = -4.0;
  local_1b8 = local_1d8;
  uStack_1b0 = 3;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = local_158;
  index_00._M_len = 3;
  index_00._M_array = local_188;
  value_00._M_len = 3;
  value_00._M_array = local_1b8;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_148,non_zero_00,index_00,value_00,3);
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_238);
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)&gtest_ar.message_,(Matrix_Sparse *)local_60);
  Disa::operator+(&local_288,(Matrix_Sparse *)&gtest_ar.message_,(Matrix_Sparse *)local_148);
  Disa::Matrix_Sparse::operator=((Matrix_Sparse *)local_238,&local_288);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_288);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)&gtest_ar.message_);
  local_2f0 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_2f4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e8,"identity.size_row()","3",&local_2f0,&local_2f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_320 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_324 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_318,"identity.size_column()","3",&local_320,&local_324);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  local_350 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_354 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_348,"identity.size_non_zero()","3",(unsigned_long *)&local_350,
             &local_354);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2ba,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_390 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_388,(size_t *)local_60);
  local_398 = (pointer)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_388,(size_t *)&local_398);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_378,"identity[0][0]","1.0",*pSVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,699,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3d0 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_3c8,(size_t *)local_60);
  local_3d8 = (pointer)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3c8,(size_t *)&local_3d8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3b8,"identity[1][1]","1.0",*pSVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,700,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_418[1] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_408,(size_t *)local_60);
  local_418[0] = 2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_408,local_418);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3f8,"identity[2][2]","1.0",*pSVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2bd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  local_440 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_148);
  local_444 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_438,"matrix.size_row()","3",&local_440,&local_444);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2bf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_470 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_148);
  local_474 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_468,"matrix.size_column()","3",&local_470,&local_474);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_4a0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_148);
  local_4a4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_498,"matrix.size_non_zero()","3",(unsigned_long *)&local_4a0,
             &local_4a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  local_4e0 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_4d8,(size_t *)local_148);
  local_4e8 = (pointer)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_4d8,(size_t *)&local_4e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4c8,"matrix[0][2]","3.0",*pSVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  local_520 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_518,(size_t *)local_148);
  local_528 = (pointer)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_518,(size_t *)&local_528);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_508,"matrix[1][1]","-4.0",*pSVar5,-4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  local_568[1] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_558,(size_t *)local_148);
  local_568[0] = 0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_558,local_568);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_548,"matrix[2][0]","5.0",*pSVar5,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  local_590 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_238);
  local_594 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_588,"matrix_result.size_row()","3",&local_590,&local_594);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  local_5c0 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_238);
  local_5c4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_5b8,"matrix_result.size_column()","3",&local_5c0,&local_5c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  local_5f0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_238);
  local_5f4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_5e8,"matrix_result.size_non_zero()","5",(unsigned_long *)&local_5f0,
             &local_5f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  local_630 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_628,(size_t *)local_238);
  local_638 = (pointer)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_628,(size_t *)&local_638);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_618,"matrix_result[0][0]","1.0",*pSVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  local_670 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_668,(size_t *)local_238);
  local_678 = (pointer)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_668,(size_t *)&local_678);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_658,"matrix_result[0][2]","3.0",*pSVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2ca,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  local_6b0 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_6a8,(size_t *)local_238);
  local_6b8 = (pointer)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_6a8,(size_t *)&local_6b8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_698,"matrix_result[1][1]","-3.0",*pSVar5,-3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  local_6f0 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_6e8,(size_t *)local_238);
  local_6f8 = (pointer)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_6e8,(size_t *)&local_6f8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_6d8,"matrix_result[2][0]","5.0",*pSVar5,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  local_738[1] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_728,(size_t *)local_238);
  local_738[0] = 2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_728,local_738);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_718,"matrix_result[2][2]","1.0",*pSVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&matrix_wrong_size.column_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cd,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&matrix_wrong_size.column_size,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&matrix_wrong_size.column_size);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_7c8[2] = 2;
  local_7c8[3] = 3;
  local_7c8[0] = 0;
  local_7c8[1] = 1;
  local_7a8 = local_7c8;
  local_7a0 = 4;
  local_7f8[0] = 2;
  local_7f8[1] = 1;
  local_7f8[2] = 0;
  local_7d8 = local_7f8;
  local_7d0 = 3;
  local_818 = 0x4014000000000000;
  gtest_dt = (DeathTest *)0x4008000000000000;
  uStack_820 = 0xc010000000000000;
  local_808 = &gtest_dt;
  uStack_800 = 3;
  non_zero._M_len = 4;
  non_zero._M_array = local_7a8;
  index._M_len = 3;
  index._M_array = local_7d8;
  value_01._M_len = 3;
  value_01._M_array = (iterator)local_808;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_798,non_zero,index,value_01,4);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("matrix + matrix_wrong_size",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x2d0,&local_830);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_830 == (pointer)0x0) goto LAB_0013d0b7;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_830);
      iVar2 = (*local_830->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_830->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_830->_vptr_DeathTest[4])(local_830,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0013cfc8;
        local_924 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_858,local_830);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::Matrix_Sparse::Matrix_Sparse
                      ((Matrix_Sparse *)&gtest_exception,(Matrix_Sparse *)local_148);
            Disa::operator+(&local_8a8,(Matrix_Sparse *)&gtest_exception,(Matrix_Sparse *)local_798)
            ;
            Disa::Matrix_Sparse::~Matrix_Sparse(&local_8a8);
            Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)&gtest_exception);
          }
          (*local_830->_vptr_DeathTest[5])(local_830,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_858);
        }
LAB_0013cfc8:
        local_924 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_924 == 0) goto LAB_0013d0b7;
    }
  }
  testing::Message::Message(&local_930);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_938,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x2d0,pcVar4);
  testing::internal::AssertHelper::operator=(&local_938,&local_930);
  testing::internal::AssertHelper::~AssertHelper(&local_938);
  testing::Message::~Message(&local_930);
LAB_0013d0b7:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_798);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_238);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_148);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, matrix_matrix_addition) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  Matrix_Sparse matrix_result;
  matrix_result = identity + matrix;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(identity[0][0], 1.0);
  EXPECT_DOUBLE_EQ(identity[1][1], 1.0);
  EXPECT_DOUBLE_EQ(identity[2][2], 1.0);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -4.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);

  EXPECT_EQ(matrix_result.size_row(), 3);
  EXPECT_EQ(matrix_result.size_column(), 3);
  EXPECT_EQ(matrix_result.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix_result[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_result[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix_result[1][1], -3.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][2], 1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix + matrix_wrong_size, "./*");
}